

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 unodb::detail::olc_impl_helpers::
 add_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
           (olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *inode,byte key_byte,
           basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,value_view v,
           olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *db_instance,
           tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
           depth,read_critical_section *node_critical_section,
           in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
           *node_in_parent,read_critical_section *parent_critical_section,
           olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>
           *cached_leaf)

{
  atomic<long> *paVar1;
  atomic<unsigned_long> *paVar2;
  long lVar3;
  uint8_t children_count_;
  optimistic_lock *poVar4;
  __int_type_conflict _Var5;
  __int_type_conflict _Var6;
  uint uVar7;
  write_guard wVar8;
  bool bVar9;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  _Var10;
  uint uVar11;
  undefined8 unaff_R12;
  ulong uVar12;
  undefined1 auVar14 [16];
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar15;
  write_guard local_50;
  write_guard write_unlock_on_exit;
  write_guard local_40;
  write_guard write_unlock_on_exit_1;
  write_guard node_write_guard;
  undefined7 uVar13;
  
  auVar14[1] = key_byte;
  auVar14[0] = key_byte;
  auVar14[2] = key_byte;
  auVar14[3] = key_byte;
  auVar14[4] = key_byte;
  auVar14[5] = key_byte;
  auVar14[6] = key_byte;
  auVar14[7] = key_byte;
  auVar14[8] = key_byte;
  auVar14[9] = key_byte;
  auVar14[10] = key_byte;
  auVar14[0xb] = key_byte;
  auVar14[0xc] = key_byte;
  auVar14[0xd] = key_byte;
  auVar14[0xe] = key_byte;
  auVar14[0xf] = key_byte;
  auVar14 = vpcmpeqb_avx(auVar14,ZEXT416((uint)(inode->
                                               super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                               ).keys));
  uVar13 = (undefined7)((ulong)unaff_R12 >> 8);
  uVar12 = CONCAT71(uVar13,1);
  uVar11 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) &
           ~(-1 << ((inode->
                    super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                    ).field_0x20 & 0x1f));
  if (uVar11 != 0) {
    uVar7 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
      }
    }
    _Var10._M_value =
         (inode->super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>).
         children._M_elems + uVar7;
    goto LAB_0014fdc0;
  }
  create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
            (cached_leaf,k,v,db_instance);
  children_count_ =
       (inode->super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>).
       field_0x20;
  if (children_count_ == '\x04') {
    basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
    ::
    make_db_inode_unique_ptr<unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
              ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                *)&stack0xffffffffffffffb0,db_instance,inode);
    bVar9 = optimistic_lock::try_upgrade_to_write_lock
                      (parent_critical_section->lock,
                       (version_type)(parent_critical_section->version).version);
    local_40.lock = (optimistic_lock *)0x0;
    if (bVar9) {
      local_40.lock = parent_critical_section->lock;
    }
    parent_critical_section->lock = (optimistic_lock *)0x0;
    if (local_40.lock == (optimistic_lock *)0x0) {
LAB_0014ff15:
      optimistic_lock::write_guard::~write_guard(&local_40);
      uVar12 = 0;
    }
    else {
      bVar9 = optimistic_lock::try_upgrade_to_write_lock
                        (node_critical_section->lock,
                         (version_type)(node_critical_section->version).version);
      write_unlock_on_exit_1.lock = (optimistic_lock *)0x0;
      if (bVar9) {
        write_unlock_on_exit_1.lock = node_critical_section->lock;
      }
      node_critical_section->lock = (optimistic_lock *)0x0;
      if (write_unlock_on_exit_1.lock == (optimistic_lock *)0x0) {
        optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
        goto LAB_0014ff15;
      }
      olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::init((olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)write_unlock_on_exit.lock,(EVP_PKEY_CTX *)db_instance);
      wVar8 = write_unlock_on_exit;
      write_unlock_on_exit.lock = (optimistic_lock *)0x0;
      if (((ulong)wVar8.lock & 7) != 0) {
        __assert_fail("(result & ptr_bit_mask) == uintptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                      ,0x182,
                      "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                     );
      }
      (node_in_parent->value)._M_i.tagged_ptr = (ulong)wVar8.lock | 2;
      if (write_unlock_on_exit_1.lock != (optimistic_lock *)0x0) {
        __assert_fail("!node_write_guard.active()",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                      ,0x5b8,
                      "static std::optional<in_critical_section<olc_node_ptr> *> unodb::detail::olc_impl_helpers::add_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, value_view, olc_db<Key, Value> &, tree_depth<basic_art_key<Key>>, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, optimistic_lock::read_critical_section &, olc_db_leaf_unique_ptr<Key, Value> &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>]"
                     );
      }
      optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
      optimistic_lock::write_guard::~write_guard(&local_40);
      LOCK();
      paVar2 = (db_instance->growing_inode_counts)._M_elems + 1;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      uVar12 = CONCAT71(uVar13,1);
    }
    std::
    unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)&stack0xffffffffffffffb0);
LAB_0014fdbe:
    _Var10._M_value =
         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0;
  }
  else {
    bVar9 = optimistic_lock::try_upgrade_to_write_lock
                      (node_critical_section->lock,
                       (version_type)(node_critical_section->version).version);
    local_50.lock = (optimistic_lock *)0x0;
    if (bVar9) {
      local_50.lock = node_critical_section->lock;
    }
    node_critical_section->lock = (optimistic_lock *)0x0;
    if (local_50.lock != (optimistic_lock *)0x0) {
      poVar4 = parent_critical_section->lock;
      _Var5 = (parent_critical_section->version).version;
      if ((poVar4->read_lock_count).super___atomic_base<long>._M_i < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      _Var6 = (poVar4->version).version.super___atomic_base<unsigned_long>._M_i;
      LOCK();
      paVar1 = &poVar4->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (_Var5 == _Var6) {
        if (lVar3 < 1) {
LAB_0014feed:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        parent_critical_section->lock = (optimistic_lock *)0x0;
        basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        ::add_to_nonfull(&inode->
                          super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                         ,cached_leaf,(tree_depth_type)depth.value,children_count_);
        optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffb0);
        goto LAB_0014fdbe;
      }
      if (lVar3 < 1) goto LAB_0014feed;
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
    optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffb0);
    _Var10._M_value =
         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0;
    uVar12 = 0;
  }
LAB_0014fdc0:
  oVar15.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._8_8_ = uVar12 & 0xffffffff;
  oVar15.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload._M_value = _Var10._M_value;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar15.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] std::optional<in_critical_section<olc_node_ptr>*>
olc_impl_helpers::add_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k, value_view v,
    olc_db<Key, Value>& db_instance, tree_depth<basic_art_key<Key>> depth,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    optimistic_lock::read_critical_section& parent_critical_section,
    olc_db_leaf_unique_ptr<Key, Value>& cached_leaf) {
  auto* const child_in_parent = inode.find_child(key_byte).second;

  if (child_in_parent == nullptr) {
    create_leaf_if_needed(cached_leaf, k, v, db_instance);

    const auto children_count = inode.get_children_count();

    if constexpr (!std::is_same_v<INode, olc_inode_256<Key, Value>>) {
      if (UNODB_DETAIL_UNLIKELY(children_count == INode::capacity)) {
        auto larger_node{
            INode::larger_derived_type::create(db_instance, inode)};
        {
          const optimistic_lock::write_guard write_unlock_on_exit{
              std::move(parent_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart()))
            return {};  // LCOV_EXCL_LINE

          optimistic_lock::write_guard node_write_guard{
              std::move(node_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(node_write_guard.must_restart())) return {};

          larger_node->init(db_instance, inode, node_write_guard,
                            std::move(cached_leaf), depth);
          *node_in_parent = detail::olc_node_ptr{
              larger_node.release(), INode::larger_derived_type::type};

          UNODB_DETAIL_ASSERT(!node_write_guard.active());
        }

#ifdef UNODB_DETAIL_WITH_STATS
        db_instance
            .template account_growing_inode<INode::larger_derived_type::type>();
#endif  // UNODB_DETAIL_WITH_STATS

        return child_in_parent;
      }
    }

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) return {};

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    inode.add_to_nonfull(std::move(cached_leaf), depth, children_count);
  }

  return child_in_parent;
}